

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *this,
          GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *old)

{
  undefined8 *puVar1;
  Data *pDVar2;
  pair<QPersistentModelIndex,_unsigned_int> *ppVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  pair<QPersistentModelIndex,_unsigned_int> *data;
  long lVar6;
  pair<QPersistentModelIndex,_unsigned_int> *this_00;
  long lVar7;
  pair<QPersistentModelIndex,_unsigned_int> *ppVar8;
  pair<QPersistentModelIndex,_unsigned_int> *other;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x0 &&
         where == GrowsAtEnd) && (pDVar2 = this->d, pDVar2 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocate
                ((QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 4),Grow);
      return;
    }
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (pair<QPersistentModelIndex,_unsigned_int> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_58,this,n,where);
    ppVar3 = local_58.ptr;
    if (local_58.ptr == (pair<QPersistentModelIndex,_unsigned_int> *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
    }
    else {
      puVar5 = (undefined1 *)local_58.size;
      if (this->size != 0) {
        lVar7 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) ||
            (old != (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar7) {
            other = this->ptr;
            ppVar8 = other + lVar7;
            do {
              this_00 = ppVar3 + local_58.size;
              QPersistentModelIndex::QPersistentModelIndex(&this_00->first,&other->first);
              this_00->second = other->second;
              other = other + 1;
              local_58.size = local_58.size + 1;
              puVar5 = (undefined1 *)local_58.size;
            } while (other < ppVar8);
          }
        }
        else if (0 < lVar7) {
          ppVar3 = this->ptr;
          lVar6 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(ppVar3->first).d + lVar6);
            uVar4 = *puVar1;
            *puVar1 = 0;
            *(undefined8 *)((long)&local_58.ptr[local_58.size].first.d + lVar6) = uVar4;
            *(undefined4 *)((long)&local_58.ptr[local_58.size].second + lVar6) =
                 *(undefined4 *)(puVar1 + 1);
            puVar5 = puVar5 + 1;
            lVar6 = lVar6 + 0x10;
          } while ((pair<QPersistentModelIndex,_unsigned_int> *)(puVar1 + 2) < ppVar3 + lVar7);
        }
      }
      local_58.size = (qsizetype)puVar5;
      pDVar2 = this->d;
      ppVar3 = this->ptr;
      this->d = local_58.d;
      this->ptr = local_58.ptr;
      puVar5 = (undefined1 *)this->size;
      this->size = local_58.size;
      local_58.d = pDVar2;
      local_58.ptr = ppVar3;
      local_58.size = (qsizetype)puVar5;
      if (old != (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x0) {
        local_58.d = old->d;
        local_58.ptr = old->ptr;
        old->d = pDVar2;
        old->ptr = ppVar3;
        local_58.size = old->size;
        old->size = (qsizetype)puVar5;
      }
      ~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }